

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_kernel.cc
# Opt level: O0

void __thiscall
ipx::BasicLuKernel::_Factorize
          (BasicLuKernel *this,Int dim,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,double pivottol,
          bool strict_abs_pivottol,SparseMatrix *L,SparseMatrix *U,
          vector<int,_std::allocator<int>_> *rowperm,vector<int,_std::allocator<int>_> *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  double dVar1;
  lu_int lVar2;
  undefined8 uVar3;
  logic_error *plVar4;
  int *Lrowidx;
  int *Lcolptr;
  Int *colperm_00;
  SparseMatrix *A;
  double *diag;
  int in_ESI;
  undefined8 in_XMM0_Qa;
  byte in_stack_00000008;
  Int num_dropped;
  Int k;
  Int rank;
  Int err;
  BasicLuHelper lu;
  bad_alloc *in_stack_fffffffffffffeb0;
  value_type_conflict2 *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  Int in_stack_fffffffffffffec4;
  size_type in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  double *in_stack_fffffffffffffee8;
  lu_int *in_stack_fffffffffffffef0;
  lu_int *in_stack_fffffffffffffef8;
  lu_int *in_stack_ffffffffffffff00;
  double *Lvalue;
  basiclu_object *in_stack_ffffffffffffff08;
  lu_int *in_stack_ffffffffffffff20;
  basiclu_object *in_stack_ffffffffffffff28;
  int local_c4;
  double local_a8;
  long local_a0;
  lu_int *in_stack_ffffffffffffff70;
  lu_int *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  
  BasicLuHelper::BasicLuHelper
            ((BasicLuHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (Int)(in_stack_fffffffffffffec8 >> 0x20));
  *(undefined8 *)(local_a0 + 0x30) = in_XMM0_Qa;
  if ((in_stack_00000008 & 1) != 0) {
    *(undefined8 *)(local_a0 + 0x28) = 0x3f50624dd2f1a9fc;
    *(undefined8 *)(local_a0 + 0x68) = 0x3ff0000000000000;
  }
  lVar2 = basiclu_obj_factorize
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (lVar2 == -9) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_fffffffffffffeb0);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((lVar2 != 0) && (lVar2 != 2)) {
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar4,"basiclu_obj_factorize failed");
    __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  dVar1 = *(double *)(local_a0 + 0x328);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x807d32);
  for (local_c4 = (int)dVar1; local_c4 < in_ESI; local_c4 = local_c4 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
  }
  SparseMatrix::resize
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (Int)(in_stack_fffffffffffffec8 >> 0x20),(Int)in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec4);
  SparseMatrix::resize
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (Int)(in_stack_fffffffffffffec8 >> 0x20),(Int)in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec4);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  Lvalue = &local_a8;
  Lrowidx = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x807e2c);
  Lcolptr = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x807e3e);
  colperm_00 = SparseMatrix::colptr((SparseMatrix *)0x807e50);
  SparseMatrix::rowidx((SparseMatrix *)0x807e64);
  SparseMatrix::values((SparseMatrix *)0x807e78);
  SparseMatrix::colptr((SparseMatrix *)0x807e8c);
  A = (SparseMatrix *)SparseMatrix::rowidx((SparseMatrix *)0x807ea0);
  diag = SparseMatrix::values((SparseMatrix *)0x807eb4);
  lVar2 = basiclu_obj_get_factors
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,colperm_00,Lcolptr,Lrowidx,
                     Lvalue,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff80);
  if (lVar2 != 0) {
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar4,"basiclu_obj_get_factors failed");
    __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  RemoveDiagonal(A,diag);
  BasicLuHelper::~BasicLuHelper((BasicLuHelper *)0x807fa2);
  return;
}

Assistant:

void BasicLuKernel::_Factorize(Int dim, const Int* Bbegin, const Int* Bend,
                               const Int* Bi, const double* Bx, double pivottol,
                               bool strict_abs_pivottol,
                               SparseMatrix* L, SparseMatrix* U,
                               std::vector<Int>* rowperm,
                               std::vector<Int>* colperm,
                               std::vector<Int>* dependent_cols) {
    BasicLuHelper lu(dim);
    lu.obj.xstore[BASICLU_REL_PIVOT_TOLERANCE] = pivottol;
    if (strict_abs_pivottol) {
        lu.obj.xstore[BASICLU_ABS_PIVOT_TOLERANCE] = kLuDependencyTol;
        lu.obj.xstore[BASICLU_REMOVE_COLUMNS] = 1;
    }
    Int err = basiclu_obj_factorize(&lu.obj, Bbegin, Bend, Bi, Bx);
    if (err == BASICLU_ERROR_out_of_memory)
        throw std::bad_alloc();
    if (err != BASICLU_OK && err != BASICLU_WARNING_singular_matrix)
        throw std::logic_error("basiclu_obj_factorize failed");

    // Extract factors. Dependent columns are at the end of the BASICLU pivot
    // sequence.
    Int rank = lu.obj.xstore[BASICLU_RANK];
    dependent_cols->clear();
    for (Int k = rank; k < dim; k++)
        dependent_cols->push_back(k);
    L->resize(dim, dim, dim + lu.obj.xstore[BASICLU_LNZ]);
    U->resize(dim, dim, dim + lu.obj.xstore[BASICLU_UNZ]);
    rowperm->resize(dim);
    colperm->resize(dim);
    err = basiclu_obj_get_factors(&lu.obj, rowperm->data(), colperm->data(),
                                  L->colptr(), L->rowidx(), L->values(),
                                  U->colptr(), U->rowidx(), U->values());
    if (err != BASICLU_OK)
        throw std::logic_error("basiclu_obj_get_factors failed");

    // Remove unit diagonal from L.
    Int num_dropped = RemoveDiagonal(*L, nullptr);
    assert(num_dropped == dim);
    assert(L->entries() == lu.obj.xstore[BASICLU_LNZ]);
}